

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32(CodedInputStream *this,uint32 *value)

{
  byte bVar1;
  byte *pbVar2;
  int64 iVar3;
  uint32 first_byte_or_zero;
  
  pbVar2 = this->buffer_;
  if (pbVar2 < this->buffer_end_) {
    bVar1 = *pbVar2;
    first_byte_or_zero = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      *value = (uint)bVar1;
      this->buffer_ = pbVar2 + 1;
      return true;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar3 = ReadVarint32Fallback(this,first_byte_or_zero);
  *value = (uint32)iVar3;
  return -1 < iVar3;
}

Assistant:

inline bool CodedInputStream::ReadVarint32(uint32* value) {
  uint32 v = 0;
  if (PROTOBUF_PREDICT_TRUE(buffer_ < buffer_end_)) {
    v = *buffer_;
    if (v < 0x80) {
      *value = v;
      Advance(1);
      return true;
    }
  }
  int64 result = ReadVarint32Fallback(v);
  *value = static_cast<uint32>(result);
  return result >= 0;
}